

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_client.hpp
# Opt level: O2

Lazy<void> __thiscall
cinatra::coro_http_client::send_fstream_with_chunked<std::shared_ptr<std::__cxx11::stringstream>>
          (coro_http_client *this,
          shared_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *source,error_code *ec)

{
  element_type *peVar1;
  char *in_RCX;
  
  peVar1 = (element_type *)operator_new(0xd0,(nothrow_t *)&std::nothrow);
  if (peVar1 == (element_type *)0x0) {
    (this->super_enable_shared_from_this<cinatra::coro_http_client>)._M_weak_this.
    super___weak_ptr<cinatra::coro_http_client,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  else {
    *(code **)&(peVar1->super_enable_shared_from_this<cinatra::coro_http_client>)._M_weak_this.
               super___weak_ptr<cinatra::coro_http_client,_(__gnu_cxx::_Lock_policy)2> =
         send_fstream_with_chunked<std::shared_ptr<std::__cxx11::stringstream>>;
    ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
    ((long)&(peVar1->super_enable_shared_from_this<cinatra::coro_http_client>)._M_weak_this.
            super___weak_ptr<cinatra::coro_http_client,_(__gnu_cxx::_Lock_policy)2> + 8))->_M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         send_fstream_with_chunked<std::shared_ptr<std::__cxx11::stringstream>>;
    *(char **)((long)(peVar1->parser_).headers_._M_elems + 0x78) = in_RCX;
    ((string_view *)((long)(peVar1->parser_).headers_._M_elems + 0x70))->_M_len = (size_t)ec;
    *(shared_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      **)((long)(peVar1->parser_).headers_._M_elems + 0x68) = source;
    *(undefined8 *)&peVar1->parser_ = 0;
    (peVar1->parser_).msg_._M_len = 0;
    (peVar1->parser_).msg_._M_str = (char *)0x0;
    (peVar1->parser_).num_headers_ = 0;
    (this->super_enable_shared_from_this<cinatra::coro_http_client>)._M_weak_this.
    super___weak_ptr<cinatra::coro_http_client,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
    *(undefined1 *)
     &(((http_header *)((long)(peVar1->parser_).headers_._M_elems + 0x80))->name)._M_len = 0;
  }
  return (LazyBase<void,_false>)(LazyBase<void,_false>)this;
}

Assistant:

async_simple::coro::Lazy<void> send_fstream_with_chunked(
      Source &source, std::error_code &ec) {
    size_t size = 0;
    std::string file_data;
    detail::resize(file_data, max_single_part_size_);
    while (!source->eof()) {
      size_t rd_size =
          source->read(file_data.data(), file_data.size()).gcount();
      std::vector<asio::const_buffer> bufs;
      std::string size_str;
      cinatra::to_chunked_buffers(bufs, size_str, {file_data.data(), rd_size},
                                  source->eof());
      if (std::tie(ec, size) = co_await async_write(bufs); ec) {
        break;
      }
    }
  }